

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drm.c
# Opt level: O0

int demmt_drm_ioctl_post
              (uint32_t fd,uint32_t id,uint8_t dir,uint8_t nr,uint16_t size,mmt_buf *buf,
              uint64_t ret,uint64_t err,void *state,mmt_memory_dump *args,int argc)

{
  undefined8 uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  __u32 _Var9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  ulong uVar13;
  undefined8 uVar14;
  ulong uVar15;
  undefined8 uVar16;
  long lVar17;
  char *pcVar18;
  ulong uVar19;
  ulong uVar20;
  char *pcVar21;
  char *pcVar22;
  undefined8 uVar23;
  char *pcVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  FILE *pFVar29;
  drm_nouveau_gem_new *g_00;
  char *pcVar30;
  char *pcVar31;
  gpu_object *pgVar32;
  char *pcVar33;
  mmt_buf *pmVar34;
  mmt_buf *pmVar35;
  mmt_buf *pmVar36;
  char *pcVar37;
  char *pcVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined8 in_stack_fffffffffffff7d8;
  undefined4 uVar41;
  undefined8 in_stack_fffffffffffff7e0;
  undefined4 uVar42;
  undefined8 in_stack_fffffffffffff7e8;
  undefined4 uVar43;
  undefined8 in_stack_fffffffffffff7f0;
  undefined4 uVar44;
  undefined8 in_stack_fffffffffffff7f8;
  undefined4 uVar45;
  undefined8 in_stack_fffffffffffff800;
  undefined4 uVar46;
  undefined8 in_stack_fffffffffffff808;
  undefined4 uVar47;
  undefined8 in_stack_fffffffffffff810;
  undefined4 uVar48;
  undefined8 in_stack_fffffffffffff818;
  undefined4 uVar49;
  undefined8 in_stack_fffffffffffff820;
  undefined4 uVar50;
  undefined8 in_stack_fffffffffffff828;
  undefined8 in_stack_fffffffffffff830;
  undefined4 uVar51;
  undefined8 in_stack_fffffffffffff840;
  undefined4 uVar52;
  char *local_230;
  char *local_1f8;
  char *local_1d0;
  char *local_1a8;
  drm_gem_flink *data_20;
  drm_auth *data_19;
  drm_mode_card_res *data_18;
  drm_set_version *data_17;
  drm_get_cap *data_16;
  drm_gem_open *data_15;
  gpu_object *obj_1;
  drm_gem_close *data_14;
  drm_auth *data_13;
  mmt_buf *b_1;
  drm_version32 *data_12;
  mmt_buf *b;
  drm_version64 *data_11;
  gpu_object *tmpobj;
  gpu_object *obj;
  gpu_object *dev_1;
  gpu_object *tmp;
  drm_nouveau_gem_info *data_10;
  drm_nouveau_gem_cpu_fini *data_9;
  drm_nouveau_gem_cpu_prep *data_8;
  mmt_buf *relocs;
  mmt_buf *push;
  mmt_buf *buffers;
  drm_nouveau_gem_pushbuf *data_7;
  drm_nouveau_gem_new *g;
  drm_nouveau_gpuobj_free *data_6;
  drm_nouveau_notifierobj_alloc *data_5;
  gpu_object *gpu_obj;
  drm_nouveau_grobj_alloc *data_4;
  int i_1;
  gpu_object *fifo_1;
  drm_nouveau_channel_free *data_3;
  gpu_object *fifo;
  gpu_object *dev;
  drm_nouveau_channel_alloc *data_2;
  drm_nouveau_setparam *data_1;
  drm_nouveau_getparam *data;
  int i;
  void *ioctl_data;
  mmt_buf *buf_local;
  uint16_t size_local;
  uint8_t nr_local;
  uint8_t dir_local;
  uint32_t id_local;
  uint32_t fd_local;
  
  pFVar29 = _stdout;
  uVar51 = (undefined4)((ulong)in_stack_fffffffffffff830 >> 0x20);
  uVar49 = (undefined4)((ulong)in_stack_fffffffffffff818 >> 0x20);
  uVar45 = (undefined4)((ulong)in_stack_fffffffffffff7f8 >> 0x20);
  uVar41 = (undefined4)((ulong)in_stack_fffffffffffff7d8 >> 0x20);
  uVar52 = (undefined4)((ulong)in_stack_fffffffffffff840 >> 0x20);
  uVar50 = (undefined4)((ulong)in_stack_fffffffffffff820 >> 0x20);
  uVar46 = (undefined4)((ulong)in_stack_fffffffffffff800 >> 0x20);
  uVar42 = (undefined4)((ulong)in_stack_fffffffffffff7e0 >> 0x20);
  uVar43 = (undefined4)((ulong)in_stack_fffffffffffff7e8 >> 0x20);
  uVar44 = (undefined4)((ulong)in_stack_fffffffffffff7f0 >> 0x20);
  uVar48 = (undefined4)((ulong)in_stack_fffffffffffff810 >> 0x20);
  uVar47 = (undefined4)((ulong)in_stack_fffffffffffff808 >> 0x20);
  g_00 = (drm_nouveau_gem_new *)(buf + 1);
  if (id == 0xc0106440) {
    if (dump_decoded_ioctl_data != 0) {
      if (indent_logs == 0) {
        uVar15._0_4_ = (g_00->info).handle;
        uVar15._4_4_ = (g_00->info).domain;
        if (uVar15 < 0xe) {
          local_1d0 = nouveau_param_names[*(long *)&g_00->info] + 0x11;
        }
        else {
          local_1d0 = "???";
        }
        uVar16._0_4_ = (g_00->info).handle;
        uVar16._4_4_ = (g_00->info).domain;
        fprintf(_stdout,"LOG: %sDRM_NOUVEAU_GETPARAM%s, param: %s%14s%s (0x%lx), value: %s0x%lx%s",
                colors->rname,colors->reset,colors->eval,local_1d0,colors->reset,uVar16,colors->num,
                *(undefined8 *)(buf + 3),colors->reset);
      }
      else {
        uVar13._0_4_ = (g_00->info).handle;
        uVar13._4_4_ = (g_00->info).domain;
        if (uVar13 < 0xe) {
          local_1a8 = nouveau_param_names[*(long *)&g_00->info] + 0x11;
        }
        else {
          local_1a8 = "???";
        }
        uVar14._0_4_ = (g_00->info).handle;
        uVar14._4_4_ = (g_00->info).domain;
        fprintf(_stdout,"%64s%sDRM_NOUVEAU_GETPARAM%s, param: %s%14s%s (0x%lx), value: %s0x%lx%s",
                " ",colors->rname,colors->reset,colors->eval,local_1a8,colors->reset,uVar14,
                colors->num,*(undefined8 *)(buf + 3),colors->reset);
      }
      if (*(long *)&g_00->info - 8U < 2) {
        uVar1 = *(undefined8 *)(buf + 3);
        auVar39._8_4_ = (int)((ulong)uVar1 >> 0x20);
        auVar39._0_8_ = uVar1;
        auVar39._12_4_ = 0x45300000;
        fprintf(_stdout," (%f MB)",
                ((auVar39._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / 1048576.0);
        if (*(ulong *)(buf + 3) >> 0x1e != 0) {
          uVar1 = *(undefined8 *)(buf + 3);
          auVar40._8_4_ = (int)((ulong)uVar1 >> 0x20);
          auVar40._0_8_ = uVar1;
          auVar40._12_4_ = 0x45300000;
          fprintf(_stdout," (%f GB)",
                  ((auVar40._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / 1073741824.0);
        }
      }
      pFVar29 = _stdout;
      pcVar30 = ret_err(ret,err);
      fprintf(pFVar29,"%s\n",pcVar30);
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
    lVar17._0_4_ = (g_00->info).handle;
    lVar17._4_4_ = (g_00->info).domain;
    if (lVar17 == 0xb) {
      demmt_drm_ioctl_post::nouveau_chipset = (int)*(undefined8 *)(buf + 3);
    }
  }
  else if (id == 0x40106441) {
    if ((dump_decoded_ioctl_data != 0) && ((ret != 0 || (err != 0)))) {
      if (indent_logs == 0) {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        uVar20._0_4_ = (g_00->info).handle;
        uVar20._4_4_ = (g_00->info).domain;
        if (uVar20 < 0xe) {
          local_230 = nouveau_param_names[*(long *)&g_00->info];
        }
        else {
          local_230 = "???";
        }
        uVar27._0_4_ = (g_00->info).handle;
        uVar27._4_4_ = (g_00->info).domain;
        uVar1 = *(undefined8 *)(buf + 3);
        pcVar31 = ret_err(ret,err);
        fprintf(pFVar29,"LOG: %sDRM_NOUVEAU_SETPARAM%s, param: %s (0x%lx), value: 0x%lx%s\n",pcVar30
                ,pcVar18,local_230,uVar27,uVar1,pcVar31);
      }
      else {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        uVar19._0_4_ = (g_00->info).handle;
        uVar19._4_4_ = (g_00->info).domain;
        if (uVar19 < 0xe) {
          local_1f8 = nouveau_param_names[*(long *)&g_00->info];
        }
        else {
          local_1f8 = "???";
        }
        uVar28._0_4_ = (g_00->info).handle;
        uVar28._4_4_ = (g_00->info).domain;
        uVar1 = *(undefined8 *)(buf + 3);
        pcVar31 = ret_err(ret,err);
        fprintf(pFVar29,"%64s%sDRM_NOUVEAU_SETPARAM%s, param: %s (0x%lx), value: 0x%lx%s\n"," ",
                pcVar30,pcVar18,local_1f8,uVar28,uVar1,pcVar31);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
  }
  else if (id == 0xc0586442) {
    if (dump_decoded_ioctl_data != 0) {
      if (indent_logs == 0) {
        fprintf(_stdout,
                "LOG: %sDRM_NOUVEAU_CHANNEL_ALLOC%s post, fb_ctxdma: 0x%0x, tt_ctxdma: 0x%0x, channel: %d, pushbuf_domains: "
                ,colors->rname,colors->reset,(ulong)(g_00->info).handle,(ulong)buf[2].len,
                CONCAT44(uVar41,buf[3].len));
      }
      else {
        fprintf(_stdout,
                "%64s%sDRM_NOUVEAU_CHANNEL_ALLOC%s post, fb_ctxdma: 0x%0x, tt_ctxdma: 0x%0x, channel: %d, pushbuf_domains: "
                ," ",colors->rname,colors->reset,(ulong)(g_00->info).handle,
                CONCAT44(uVar41,buf[2].len),CONCAT44(uVar42,buf[3].len));
      }
      decode_domain(buf[4].len,10);
      fprintf(_stdout,", notifier: 0x%0x, nr_subchan: %d",(ulong)buf[5].len,(ulong)buf[0x16].len);
      for (data._4_4_ = 0; pFVar29 = _stdout, (int)data._4_4_ < 8; data._4_4_ = data._4_4_ + 1) {
        if ((buf[(long)(int)data._4_4_ * 2 + 6].len != 0) ||
           (buf[(long)(int)data._4_4_ * 2 + 7].len != 0)) {
          fprintf(_stdout," subchan[%d]=<h:0x%0x, c:0x%0x>",(ulong)data._4_4_,
                  (ulong)buf[(long)(int)data._4_4_ * 2 + 6].len,
                  (ulong)buf[(long)(int)data._4_4_ * 2 + 7].len);
        }
      }
      pcVar30 = ret_err(ret,err);
      fprintf(pFVar29,"%s\n",pcVar30);
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
    pgVar32 = gpu_object_add(fd,buf[3].len,buf[3].len,buf[3].len,0x80);
    nvrm_device_set_chipset(pgVar32,demmt_drm_ioctl_post::nouveau_chipset);
    pgVar32 = gpu_object_add(fd,buf[3].len,buf[3].len,0xf1f0eeee,0x506f);
    get_fifo_state(pgVar32);
  }
  else if (id == 0x40046443) {
    if ((dump_decoded_ioctl_data != 0) && ((ret != 0 || (err != 0)))) {
      if (indent_logs == 0) {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        uVar2 = (g_00->info).handle;
        pcVar31 = ret_err(ret,err);
        fprintf(pFVar29,"LOG: %sDRM_NOUVEAU_CHANNEL_FREE%s, channel: %d%s\n",pcVar30,pcVar18,
                (ulong)uVar2,pcVar31);
      }
      else {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        uVar2 = (g_00->info).handle;
        pcVar31 = ret_err(ret,err);
        fprintf(pFVar29,"%64s%sDRM_NOUVEAU_CHANNEL_FREE%s, channel: %d%s\n"," ",pcVar30,pcVar18,
                (ulong)uVar2,pcVar31);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
    pgVar32 = gpu_object_find((g_00->info).handle,0xf1f0eeee);
    for (data_4._4_4_ = 0; data_4._4_4_ < pgVar32->children_space; data_4._4_4_ = data_4._4_4_ + 1)
    {
      if (pgVar32->children_objects[data_4._4_4_] != (gpu_object *)0x0) {
        gpu_object_destroy(pgVar32->children_objects[data_4._4_4_]);
      }
    }
    gpu_object_destroy(pgVar32);
    pgVar32 = gpu_object_find((g_00->info).handle,(g_00->info).handle);
    gpu_object_destroy(pgVar32);
  }
  else if (id == 0x400c6444) {
    if ((dump_decoded_ioctl_data != 0) && ((ret != 0 || (err != 0)))) {
      if (indent_logs == 0) {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        uVar2 = (g_00->info).handle;
        pcVar31 = colors->num;
        uVar3 = buf[2].len;
        pcVar21 = colors->reset;
        pcVar38 = colors->eval;
        uVar4 = buf[3].len;
        pcVar22 = colors->reset;
        pcVar33 = ret_err(ret,err);
        fprintf(pFVar29,
                "LOG: %sDRM_NOUVEAU_GROBJ_ALLOC%s, channel: %d, handle: %s0x%x%s, class: %s0x%x%s%s\n"
                ,pcVar30,pcVar18,(ulong)uVar2,pcVar31,CONCAT44(uVar41,uVar3),pcVar21,pcVar38,
                CONCAT44(uVar44,uVar4),pcVar22,pcVar33);
      }
      else {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        uVar2 = (g_00->info).handle;
        pcVar31 = colors->num;
        uVar3 = buf[2].len;
        pcVar21 = colors->reset;
        pcVar38 = colors->eval;
        uVar4 = buf[3].len;
        pcVar22 = colors->reset;
        pcVar33 = ret_err(ret,err);
        fprintf(pFVar29,
                "%64s%sDRM_NOUVEAU_GROBJ_ALLOC%s, channel: %d, handle: %s0x%x%s, class: %s0x%x%s%s\n"
                ," ",pcVar30,pcVar18,(ulong)uVar2,pcVar31,CONCAT44(uVar42,uVar3),pcVar21,pcVar38,
                CONCAT44(uVar45,uVar4),pcVar22,pcVar33);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
    pgVar32 = gpu_object_add(fd,(g_00->info).handle,0xf1f0eeee,buf[2].len,buf[3].len);
    pushbuf_add_object(buf[2].len,buf[3].len,pgVar32);
    pushbuf_add_object_name(buf[2].len,buf[3].len,pgVar32);
  }
  else if (id == 0xc0106445) {
    if (dump_decoded_ioctl_data != 0) {
      if (indent_logs == 0) {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        uVar2 = (g_00->info).handle;
        uVar6 = buf[2].len;
        uVar3 = buf[3].len;
        uVar4 = buf[4].len;
        pcVar31 = ret_err(ret,err);
        fprintf(pFVar29,
                "LOG: %sDRM_NOUVEAU_NOTIFIEROBJ_ALLOC%s post, channel: %d, handle: 0x%0x, size: %d, offset: %d%s\n"
                ,pcVar30,pcVar18,(ulong)uVar2,(ulong)uVar6,CONCAT44(uVar41,uVar3),
                CONCAT44(uVar42,uVar4),pcVar31);
      }
      else {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        uVar2 = (g_00->info).handle;
        uVar3 = buf[2].len;
        uVar4 = buf[3].len;
        uVar5 = buf[4].len;
        pcVar31 = ret_err(ret,err);
        fprintf(pFVar29,
                "%64s%sDRM_NOUVEAU_NOTIFIEROBJ_ALLOC%s post, channel: %d, handle: 0x%0x, size: %d, offset: %d%s\n"
                ," ",pcVar30,pcVar18,(ulong)uVar2,CONCAT44(uVar41,uVar3),CONCAT44(uVar42,uVar4),
                CONCAT44(uVar43,uVar5),pcVar31);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
    gpu_object_add(fd,(g_00->info).handle,(g_00->info).handle,buf[2].len,0);
  }
  else if (id == 0x40086446) {
    if ((dump_decoded_ioctl_data != 0) && ((ret != 0 || (err != 0)))) {
      if (indent_logs == 0) {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        uVar2 = (g_00->info).handle;
        uVar6 = buf[2].len;
        pcVar31 = ret_err(ret,err);
        fprintf(pFVar29,"LOG: %sDRM_NOUVEAU_GPUOBJ_FREE%s, channel: %d, handle: 0x%0x%s\n",pcVar30,
                pcVar18,(ulong)uVar2,(ulong)uVar6,pcVar31);
      }
      else {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        uVar2 = (g_00->info).handle;
        uVar3 = buf[2].len;
        pcVar31 = ret_err(ret,err);
        fprintf(pFVar29,"%64s%sDRM_NOUVEAU_GPUOBJ_FREE%s, channel: %d, handle: 0x%0x%s\n"," ",
                pcVar30,pcVar18,(ulong)uVar2,CONCAT44(uVar41,uVar3),pcVar31);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
    pgVar32 = gpu_object_find((g_00->info).handle,buf[2].len);
    gpu_object_destroy(pgVar32);
  }
  else if (id == 0xc0306480) {
    if (dump_decoded_ioctl_data != 0) {
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG: %sDRM_NOUVEAU_GEM_NEW%s post, ",colors->rname,colors->reset);
      }
      else {
        fprintf(_stdout,"%64s%sDRM_NOUVEAU_GEM_NEW%s post, "," ",colors->rname,colors->reset);
      }
      dump_drm_nouveau_gem_new(g_00);
      pFVar29 = _stdout;
      pcVar30 = ret_err(ret,err);
      fprintf(pFVar29,"%s\n",pcVar30);
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
    drm_nouveau_gem_new(fd,buf[0xb].len,buf[0xb].len,(drm_nouveau_gem_info *)g_00);
  }
  else if (id == 0xc0406481) {
    pmVar34 = find_ptr(*(uint64_t *)(buf + 3),args,argc);
    pmVar35 = find_ptr(*(uint64_t *)(buf + 9),args,argc);
    pmVar36 = find_ptr(*(uint64_t *)(buf + 7),args,argc);
    pFVar29 = _stdout;
    if (dump_decoded_ioctl_data != 0) {
      if (indent_logs == 0) {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        uVar2 = (g_00->info).handle;
        pcVar31 = colors->num;
        uVar3 = buf[2].len;
        pcVar21 = colors->reset;
        uVar1 = *(undefined8 *)(buf + 3);
        pcVar38 = colors->num;
        uVar4 = buf[5].len;
        pcVar22 = colors->reset;
        uVar23 = *(undefined8 *)(buf + 7);
        pcVar33 = colors->num;
        uVar5 = buf[6].len;
        pcVar24 = colors->reset;
        uVar25 = *(undefined8 *)(buf + 9);
        uVar7 = buf[0xb].len;
        uVar8 = buf[0xc].len;
        uVar26 = *(undefined8 *)(buf + 0xd);
        uVar27 = *(undefined8 *)(buf + 0xf);
        pcVar37 = ret_err(ret,err);
        fprintf(pFVar29,
                "LOG: %sDRM_NOUVEAU_GEM_PUSHBUF%s post, channel: %d, nr_buffers: %s%d%s, buffers: 0x%lx, nr_relocs: %s%d%s, relocs: 0x%lx, nr_push: %s%d%s, push: 0x%lx, suffix0: 0x%x, suffix1: 0x%x, vram_available: %lu, gart_available: %lu%s\n"
                ,pcVar30,pcVar18,(ulong)uVar2,pcVar31,CONCAT44(uVar41,uVar3),pcVar21,uVar1,pcVar38,
                CONCAT44(uVar45,uVar4),pcVar22,uVar23,pcVar33,CONCAT44(uVar49,uVar5),pcVar24,uVar25,
                CONCAT44(uVar51,uVar7),uVar8,uVar26,uVar27,pcVar37);
      }
      else {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        uVar2 = (g_00->info).handle;
        pcVar31 = colors->num;
        uVar3 = buf[2].len;
        pcVar21 = colors->reset;
        uVar1 = *(undefined8 *)(buf + 3);
        pcVar38 = colors->num;
        uVar4 = buf[5].len;
        pcVar22 = colors->reset;
        uVar23 = *(undefined8 *)(buf + 7);
        pcVar33 = colors->num;
        uVar5 = buf[6].len;
        pcVar24 = colors->reset;
        uVar25 = *(undefined8 *)(buf + 9);
        uVar7 = buf[0xb].len;
        uVar8 = buf[0xc].len;
        uVar26 = *(undefined8 *)(buf + 0xd);
        uVar27 = *(undefined8 *)(buf + 0xf);
        pcVar37 = ret_err(ret,err);
        fprintf(pFVar29,
                "%64s%sDRM_NOUVEAU_GEM_PUSHBUF%s post, channel: %d, nr_buffers: %s%d%s, buffers: 0x%lx, nr_relocs: %s%d%s, relocs: 0x%lx, nr_push: %s%d%s, push: 0x%lx, suffix0: 0x%x, suffix1: 0x%x, vram_available: %lu, gart_available: %lu%s\n"
                ," ",pcVar30,pcVar18,(ulong)uVar2,pcVar31,CONCAT44(uVar42,uVar3),pcVar21,uVar1,
                pcVar38,CONCAT44(uVar46,uVar4),pcVar22,uVar23,pcVar33,CONCAT44(uVar50,uVar5),pcVar24
                ,uVar25,uVar7,CONCAT44(uVar52,uVar8),uVar26,uVar27,pcVar37);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
    if (((pmVar34 != (mmt_buf *)0x0) || (pmVar35 != (mmt_buf *)0x0)) || (pmVar36 != (mmt_buf *)0x0))
    {
      demmt_nouveau_decode_gem_pushbuf_data
                (buf[2].len,(drm_nouveau_gem_pushbuf_bo *)(pmVar34 + 1),buf[6].len,
                 (drm_nouveau_gem_pushbuf_push *)(pmVar35 + 1),buf[5].len,
                 (drm_nouveau_gem_pushbuf_reloc *)(pmVar36 + 1));
    }
  }
  else if (id == 0x40086482) {
    if ((dump_decoded_ioctl_data != 0) && ((ret != 0 || (err != 0)))) {
      if (indent_logs == 0) {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        uVar2 = (g_00->info).handle;
        uVar6 = buf[2].len;
        pcVar31 = ret_err(ret,err);
        fprintf(pFVar29,"LOG: %sDRM_NOUVEAU_GEM_CPU_PREP%s, handle: %d, flags: 0x%0x%s\n",pcVar30,
                pcVar18,(ulong)uVar2,(ulong)uVar6,pcVar31);
      }
      else {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        uVar2 = (g_00->info).handle;
        uVar3 = buf[2].len;
        pcVar31 = ret_err(ret,err);
        fprintf(pFVar29,"%64s%sDRM_NOUVEAU_GEM_CPU_PREP%s, handle: %d, flags: 0x%0x%s\n"," ",pcVar30
                ,pcVar18,(ulong)uVar2,CONCAT44(uVar41,uVar3),pcVar31);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
  }
  else if (id == 0x40046483) {
    if ((dump_decoded_ioctl_data != 0) && ((ret != 0 || (err != 0)))) {
      if (indent_logs == 0) {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        uVar2 = (g_00->info).handle;
        pcVar31 = ret_err(ret,err);
        fprintf(pFVar29,"LOG: %sDRM_NOUVEAU_GEM_CPU_FINI%s, handle: %d%s\n",pcVar30,pcVar18,
                (ulong)uVar2,pcVar31);
      }
      else {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        uVar2 = (g_00->info).handle;
        pcVar31 = ret_err(ret,err);
        fprintf(pFVar29,"%64s%sDRM_NOUVEAU_GEM_CPU_FINI%s, handle: %d%s\n"," ",pcVar30,pcVar18,
                (ulong)uVar2,pcVar31);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
  }
  else if (id == 0xc0286484) {
    if (dump_decoded_ioctl_data != 0) {
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG: %sDRM_NOUVEAU_GEM_INFO%s post, ",colors->rname,colors->reset);
      }
      else {
        fprintf(_stdout,"%64s%sDRM_NOUVEAU_GEM_INFO%s post, "," ",colors->rname,colors->reset);
      }
      dump_drm_nouveau_gem_info((drm_nouveau_gem_info *)g_00);
      pFVar29 = _stdout;
      pcVar30 = ret_err(ret,err);
      fprintf(pFVar29,"%s\n",pcVar30);
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
    obj = (gpu_object *)0x0;
    tmpobj = (gpu_object *)0x0;
    for (dev_1 = gpu_objects; dev_1 != (gpu_object *)0x0; dev_1 = dev_1->next) {
      pgVar32 = tmpobj;
      if ((dev_1->class_ == 0x80) && (dev_1->fd == fd)) {
        obj = dev_1;
        pgVar32 = gpu_object_find(dev_1->cid,(g_00->info).handle);
        if ((pgVar32 != (gpu_object *)0x0) && (tmpobj != (gpu_object *)0x0)) {
          fprintf(_stdout,
                  "ERROR: can\'t uniquely determine object, assuming it\'s the first one%s\n","");
          if (mmt_sync_fd != -1) {
            fflush(_stdout);
          }
          break;
        }
      }
      tmpobj = pgVar32;
    }
    if (obj == (gpu_object *)0x0) {
      fprintf(_stdout,"ERROR: can\'t find matching device object%s\n","");
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
    else if (tmpobj == (gpu_object *)0x0) {
      drm_nouveau_gem_new(fd,obj->cid,obj->handle,(drm_nouveau_gem_info *)g_00);
    }
    else {
      fprintf(_stdout,"ERROR: FIXME: DRM_NOUVEAU_GEM_INFO on known object%s\n","");
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
  }
  else if (id == 0xc0406400) {
    if (dump_decoded_ioctl_data != 0) {
      if (indent_logs == 0) {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        pcVar31 = colors->eval;
        uVar2 = (g_00->info).handle;
        uVar3 = buf[2].len;
        uVar4 = buf[3].len;
        pcVar21 = colors->reset;
        uVar1 = *(undefined8 *)(buf + 7);
        uVar23 = *(undefined8 *)(buf + 5);
        uVar25 = *(undefined8 *)(buf + 0xb);
        uVar26 = *(undefined8 *)(buf + 9);
        uVar27 = *(undefined8 *)(buf + 0xf);
        uVar28 = *(undefined8 *)(buf + 0xd);
        pcVar38 = ret_err(ret,err);
        fprintf(pFVar29,
                "LOG: %sDRM_IOCTL_VERSION64%s, version: %s%d.%d.%d%s, name_addr: 0x%lx, name_len: %lu, date_addr: 0x%lx, date_len: %lu, desc_addr: 0x%lx, desc_len: %lu%s\n"
                ,pcVar30,pcVar18,pcVar31,(ulong)uVar2,CONCAT44(uVar41,uVar3),CONCAT44(uVar42,uVar4),
                pcVar21,uVar1,uVar23,uVar25,uVar26,uVar27,uVar28,pcVar38);
      }
      else {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        pcVar31 = colors->eval;
        _Var9 = (g_00->info).handle;
        uVar3 = buf[2].len;
        uVar4 = buf[3].len;
        pcVar21 = colors->reset;
        uVar1 = *(undefined8 *)(buf + 7);
        uVar23 = *(undefined8 *)(buf + 5);
        uVar25 = *(undefined8 *)(buf + 0xb);
        uVar26 = *(undefined8 *)(buf + 9);
        uVar27 = *(undefined8 *)(buf + 0xf);
        uVar28 = *(undefined8 *)(buf + 0xd);
        pcVar38 = ret_err(ret,err);
        fprintf(pFVar29,
                "%64s%sDRM_IOCTL_VERSION64%s, version: %s%d.%d.%d%s, name_addr: 0x%lx, name_len: %lu, date_addr: 0x%lx, date_len: %lu, desc_addr: 0x%lx, desc_len: %lu%s\n"
                ," ",pcVar30,pcVar18,pcVar31,CONCAT44(uVar41,_Var9),CONCAT44(uVar42,uVar3),
                CONCAT44(uVar43,uVar4),pcVar21,uVar1,uVar23,uVar25,uVar26,uVar27,uVar28,pcVar38);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
      pmVar34 = find_ptr(*(uint64_t *)(buf + 7),args,argc);
      if (pmVar34 != (mmt_buf *)0x0) {
        dump_mmt_buf_as_text(pmVar34,"name");
      }
      pmVar34 = find_ptr(*(uint64_t *)(buf + 0xb),args,argc);
      if (pmVar34 != (mmt_buf *)0x0) {
        dump_mmt_buf_as_text(pmVar34,"date");
      }
      pmVar34 = find_ptr(*(uint64_t *)(buf + 0xf),args,argc);
      if (pmVar34 != (mmt_buf *)0x0) {
        dump_mmt_buf_as_text(pmVar34,"desc");
      }
    }
  }
  else if (id == 0xc0246400) {
    if (dump_decoded_ioctl_data != 0) {
      if (indent_logs == 0) {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        pcVar31 = colors->eval;
        uVar2 = (g_00->info).handle;
        uVar3 = buf[2].len;
        uVar4 = buf[3].len;
        pcVar21 = colors->reset;
        uVar5 = buf[5].len;
        uVar7 = buf[4].len;
        uVar8 = buf[7].len;
        uVar10 = buf[6].len;
        uVar11 = buf[9].len;
        uVar12 = buf[8].len;
        pcVar38 = ret_err(ret,err);
        fprintf(pFVar29,
                "LOG: %sDRM_IOCTL_VERSION32%s, version: %s%d.%d.%d%s, name_addr: 0x%x, name_len: %d, date_addr: 0x%x, date_len: %d, desc_addr: 0x%x, desc_len: %d%s\n"
                ,pcVar30,pcVar18,pcVar31,(ulong)uVar2,CONCAT44(uVar41,uVar3),CONCAT44(uVar42,uVar4),
                pcVar21,CONCAT44(uVar44,uVar5),CONCAT44(uVar45,uVar7),CONCAT44(uVar46,uVar8),
                CONCAT44(uVar47,uVar10),CONCAT44(uVar48,uVar11),CONCAT44(uVar49,uVar12),pcVar38);
      }
      else {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        pcVar31 = colors->eval;
        _Var9 = (g_00->info).handle;
        uVar3 = buf[2].len;
        uVar4 = buf[3].len;
        pcVar21 = colors->reset;
        uVar5 = buf[5].len;
        uVar7 = buf[4].len;
        uVar8 = buf[7].len;
        uVar10 = buf[6].len;
        uVar11 = buf[9].len;
        uVar12 = buf[8].len;
        pcVar38 = ret_err(ret,err);
        fprintf(pFVar29,
                "%64s%sDRM_IOCTL_VERSION32%s, version: %s%d.%d.%d%s, name_addr: 0x%x, name_len: %d, date_addr: 0x%x, date_len: %d, desc_addr: 0x%x, desc_len: %d%s\n"
                ," ",pcVar30,pcVar18,pcVar31,CONCAT44(uVar41,_Var9),CONCAT44(uVar42,uVar3),
                CONCAT44(uVar43,uVar4),pcVar21,CONCAT44(uVar45,uVar5),CONCAT44(uVar46,uVar7),
                CONCAT44(uVar47,uVar8),CONCAT44(uVar48,uVar10),CONCAT44(uVar49,uVar11),
                CONCAT44(uVar50,uVar12),pcVar38);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
      pmVar34 = find_ptr((ulong)buf[5].len,args,argc);
      if (pmVar34 != (mmt_buf *)0x0) {
        dump_mmt_buf_as_text(pmVar34,"name");
      }
      pmVar34 = find_ptr((ulong)buf[7].len,args,argc);
      if (pmVar34 != (mmt_buf *)0x0) {
        dump_mmt_buf_as_text(pmVar34,"date");
      }
      pmVar34 = find_ptr((ulong)buf[9].len,args,argc);
      if (pmVar34 != (mmt_buf *)0x0) {
        dump_mmt_buf_as_text(pmVar34,"desc");
      }
    }
  }
  else if (id == 0x80046402) {
    if (dump_decoded_ioctl_data != 0) {
      if (indent_logs == 0) {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        uVar2 = (g_00->info).handle;
        pcVar31 = ret_err(ret,err);
        fprintf(pFVar29,"LOG: %sDRM_IOCTL_GET_MAGIC%s, magic: 0x%08x%s\n",pcVar30,pcVar18,
                (ulong)uVar2,pcVar31);
      }
      else {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        uVar2 = (g_00->info).handle;
        pcVar31 = ret_err(ret,err);
        fprintf(pFVar29,"%64s%sDRM_IOCTL_GET_MAGIC%s, magic: 0x%08x%s\n"," ",pcVar30,pcVar18,
                (ulong)uVar2,pcVar31);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
  }
  else if (id == 0x40086409) {
    if ((dump_decoded_ioctl_data != 0) && ((ret != 0 || (err != 0)))) {
      if (indent_logs == 0) {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        uVar2 = (g_00->info).handle;
        pcVar31 = ret_err(ret,err);
        fprintf(pFVar29,"LOG: %sDRM_IOCTL_GEM_CLOSE%s, handle: %d%s\n",pcVar30,pcVar18,(ulong)uVar2,
                pcVar31);
      }
      else {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        uVar2 = (g_00->info).handle;
        pcVar31 = ret_err(ret,err);
        fprintf(pFVar29,"%64s%sDRM_IOCTL_GEM_CLOSE%s, handle: %d%s\n"," ",pcVar30,pcVar18,
                (ulong)uVar2,pcVar31);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
    pgVar32 = gpu_object_find(0,(g_00->info).handle);
    if (pgVar32 != (gpu_object *)0x0) {
      gpu_object_destroy(pgVar32);
    }
  }
  else if (id == 0xc010640b) {
    if (dump_decoded_ioctl_data != 0) {
      if (indent_logs == 0) {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        pcVar31 = colors->eval;
        uVar2 = (g_00->info).handle;
        pcVar21 = colors->reset;
        pcVar38 = colors->num;
        uVar3 = buf[2].len;
        pcVar22 = colors->reset;
        uVar1 = *(undefined8 *)(buf + 3);
        pcVar33 = ret_err(ret,err);
        fprintf(pFVar29,
                "LOG: %sDRM_IOCTL_GEM_OPEN%s post, name: %s%d%s, handle: %s%d%s, size: %llu%s\n",
                pcVar30,pcVar18,pcVar31,(ulong)uVar2,pcVar21,pcVar38,CONCAT44(uVar43,uVar3),pcVar22,
                uVar1,pcVar33);
      }
      else {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        pcVar31 = colors->eval;
        _Var9 = (g_00->info).handle;
        pcVar21 = colors->reset;
        pcVar38 = colors->num;
        uVar3 = buf[2].len;
        pcVar22 = colors->reset;
        uVar1 = *(undefined8 *)(buf + 3);
        pcVar33 = ret_err(ret,err);
        fprintf(pFVar29,
                "%64s%sDRM_IOCTL_GEM_OPEN%s post, name: %s%d%s, handle: %s%d%s, size: %llu%s\n"," ",
                pcVar30,pcVar18,pcVar31,CONCAT44(uVar41,_Var9),pcVar21,pcVar38,
                CONCAT44(uVar44,uVar3),pcVar22,uVar1,pcVar33);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
  }
  else if (id == 0xc010640c) {
    if (dump_decoded_ioctl_data != 0) {
      if (indent_logs == 0) {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        pcVar31 = colors->iname;
        uVar25._0_4_ = (g_00->info).handle;
        uVar25._4_4_ = (g_00->info).domain;
        pcVar21 = colors->reset;
        pcVar38 = colors->num;
        uVar1 = *(undefined8 *)(buf + 3);
        pcVar22 = colors->reset;
        pcVar33 = ret_err(ret,err);
        fprintf(pFVar29,"LOG: %sDRM_IOCTL_GET_CAP%s, capability: %s%llu%s, value: %s%llu%s%s\n",
                pcVar30,pcVar18,pcVar31,uVar25,pcVar21,pcVar38,uVar1,pcVar22,pcVar33);
      }
      else {
        pcVar30 = colors->rname;
        pcVar18 = colors->reset;
        pcVar31 = colors->iname;
        uVar26._0_4_ = (g_00->info).handle;
        uVar26._4_4_ = (g_00->info).domain;
        pcVar21 = colors->reset;
        pcVar38 = colors->num;
        uVar1 = *(undefined8 *)(buf + 3);
        pcVar22 = colors->reset;
        pcVar33 = ret_err(ret,err);
        fprintf(pFVar29,"%64s%sDRM_IOCTL_GET_CAP%s, capability: %s%llu%s, value: %s%llu%s%s\n"," ",
                pcVar30,pcVar18,pcVar31,uVar26,pcVar21,pcVar38,uVar1,pcVar22,pcVar33);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
  }
  else if (id == 0xc0106407) {
    if (dump_decoded_ioctl_data != 0) {
      if (indent_logs == 0) {
        fprintf(_stdout,
                "LOG: %sDRM_IOCTL_SET_VERSION%s post, di_major: %2d, di_minor: %2d, dd_major: %2d, dd_minor: %2d\n"
                ,colors->rname,colors->reset,(ulong)(g_00->info).handle,(ulong)buf[2].len,
                CONCAT44(uVar41,buf[3].len),CONCAT44(uVar42,buf[4].len));
      }
      else {
        fprintf(_stdout,
                "%64s%sDRM_IOCTL_SET_VERSION%s post, di_major: %2d, di_minor: %2d, dd_major: %2d, dd_minor: %2d\n"
                ," ",colors->rname,colors->reset,(ulong)(g_00->info).handle,
                CONCAT44(uVar41,buf[2].len),CONCAT44(uVar42,buf[3].len),CONCAT44(uVar43,buf[4].len))
        ;
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
  }
  else if (id == 0xc04064a0) {
    if (dump_decoded_ioctl_data != 0) {
      if (indent_logs == 0) {
        uVar1._0_4_ = (g_00->info).handle;
        uVar1._4_4_ = (g_00->info).domain;
        fprintf(_stdout,
                "LOG: %sDRM_IOCTL_MODE_GETRESOURCES%s post, fb_id_ptr: %p, crtc_id_ptr: %p, connector_id_ptr: %p, encoder_id_ptr: %p, count_fbs: %d, count_crtcs: %d, count_connectors: %d, count_encoders: %d, min_width: %d, max_width: %4d, min_height: %d, max_height: %4d\n"
                ,colors->rname,colors->reset,uVar1,*(undefined8 *)(buf + 3),*(undefined8 *)(buf + 5)
                ,*(undefined8 *)(buf + 7),CONCAT44(uVar43,buf[9].len),CONCAT44(uVar44,buf[10].len),
                CONCAT44(uVar45,buf[0xb].len),CONCAT44(uVar46,buf[0xc].len),
                CONCAT44(uVar47,buf[0xd].len),CONCAT44(uVar48,buf[0xe].len),
                CONCAT44(uVar49,buf[0xf].len),CONCAT44(uVar50,buf[0x10].len));
      }
      else {
        uVar23._0_4_ = (g_00->info).handle;
        uVar23._4_4_ = (g_00->info).domain;
        fprintf(_stdout,
                "%64s%sDRM_IOCTL_MODE_GETRESOURCES%s post, fb_id_ptr: %p, crtc_id_ptr: %p, connector_id_ptr: %p, encoder_id_ptr: %p, count_fbs: %d, count_crtcs: %d, count_connectors: %d, count_encoders: %d, min_width: %d, max_width: %4d, min_height: %d, max_height: %4d\n"
                ," ",colors->rname,colors->reset,uVar23,*(undefined8 *)(buf + 3),
                *(undefined8 *)(buf + 5),*(undefined8 *)(buf + 7),CONCAT44(uVar44,buf[9].len),
                CONCAT44(uVar45,buf[10].len),CONCAT44(uVar46,buf[0xb].len),
                CONCAT44(uVar47,buf[0xc].len),CONCAT44(uVar48,buf[0xd].len),
                CONCAT44(uVar49,buf[0xe].len),CONCAT44(uVar50,buf[0xf].len),
                CONCAT44((int)((ulong)in_stack_fffffffffffff828 >> 0x20),buf[0x10].len));
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
  }
  else if (id == 0x641e) {
    if (dump_decoded_ioctl_data != 0) {
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG: %sDRM_IOCTL_SET_MASTER%s\n",colors->rname,colors->reset);
      }
      else {
        fprintf(_stdout,"%64s%sDRM_IOCTL_SET_MASTER%s\n"," ",colors->rname,colors->reset);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
  }
  else if (id == 0x641f) {
    if (dump_decoded_ioctl_data != 0) {
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG: %sDRM_IOCTL_DROP_MASTER%s\n",colors->rname,colors->reset);
      }
      else {
        fprintf(_stdout,"%64s%sDRM_IOCTL_DROP_MASTER%s\n"," ",colors->rname,colors->reset);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
  }
  else if (id == 0x40046411) {
    if (dump_decoded_ioctl_data != 0) {
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG: %sDRM_IOCTL_AUTH_MAGIC%s, magic: 0x%x\n",colors->rname,colors->reset,
                (ulong)(g_00->info).handle);
      }
      else {
        fprintf(_stdout,"%64s%sDRM_IOCTL_AUTH_MAGIC%s, magic: 0x%x\n"," ",colors->rname,
                colors->reset,(ulong)(g_00->info).handle);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
  }
  else {
    if (id != 0xc008640a) {
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG: %sunknown drm ioctl%s %x\n",colors->err,colors->reset,(ulong)nr);
      }
      else {
        fprintf(_stdout,"%64s%sunknown drm ioctl%s %x\n"," ",colors->err,colors->reset,(ulong)nr);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
      return 1;
    }
    if (dump_decoded_ioctl_data != 0) {
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG: %sDRM_IOCTL_GEM_FLINK%s, handle: 0x%x, name: 0x%x\n",colors->rname,
                colors->reset,(ulong)(g_00->info).handle,(ulong)buf[2].len);
      }
      else {
        fprintf(_stdout,"%64s%sDRM_IOCTL_GEM_FLINK%s, handle: 0x%x, name: 0x%x\n"," ",colors->rname,
                colors->reset,(ulong)(g_00->info).handle,CONCAT44(uVar41,buf[2].len));
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
  }
  return 0;
}

Assistant:

int demmt_drm_ioctl_post(uint32_t fd, uint32_t id, uint8_t dir, uint8_t nr, uint16_t size,
		struct mmt_buf *buf, uint64_t ret, uint64_t err, void *state,
		struct mmt_memory_dump *args, int argc)
{
	static int nouveau_chipset; // hack

	void *ioctl_data = buf->data;

	int i;
	if (id == DRM_NOUVEAU_IOCTL_GETPARAM)
	{
		struct drm_nouveau_getparam *data = ioctl_data;

		if (dump_decoded_ioctl_data)
		{
			mmt_log("%sDRM_NOUVEAU_GETPARAM%s, param: %s%14s%s (0x%" PRIx64 "), value: %s0x%" PRIx64 "%s",
					colors->rname, colors->reset, colors->eval,
					data->param < ARRAY_SIZE(nouveau_param_names) ? nouveau_param_names[data->param] + 17 : "???",
					colors->reset, data->param, colors->num, data->value, colors->reset);
			switch (data->param)
			{
				case NOUVEAU_GETPARAM_FB_SIZE:
				case NOUVEAU_GETPARAM_AGP_SIZE:
					mmt_log_cont(" (%f MB)", ((double)data->value) / (1 << 20));
					if (data->value >> 30 > 0)
						mmt_log_cont(" (%f GB)", ((double)data->value) / (1 << 30));
					break;
				default:
					break;
			}
			mmt_log_cont("%s\n", ret_err(ret, err));
		}

		if (data->param == NOUVEAU_GETPARAM_CHIPSET_ID)
			nouveau_chipset = data->value;
	}
	else if (id == DRM_NOUVEAU_IOCTL_SETPARAM)
	{
		struct drm_nouveau_setparam *data = ioctl_data;

		if (dump_decoded_ioctl_data && (ret || err))
			mmt_log("%sDRM_NOUVEAU_SETPARAM%s, param: %s (0x%" PRIx64 "), value: 0x%" PRIx64 "%s\n",
					colors->rname, colors->reset,
					data->param < ARRAY_SIZE(nouveau_param_names) ? nouveau_param_names[data->param] : "???",
					data->param, data->value, ret_err(ret, err));
	}
	else if (id == DRM_NOUVEAU_IOCTL_CHANNEL_ALLOC)
	{
		struct drm_nouveau_channel_alloc *data = ioctl_data;

		if (dump_decoded_ioctl_data)
		{
			mmt_log("%sDRM_NOUVEAU_CHANNEL_ALLOC%s post, fb_ctxdma: 0x%0x, tt_ctxdma: 0x%0x, channel: %d, pushbuf_domains: ",
					colors->rname, colors->reset, data->fb_ctxdma_handle,
					data->tt_ctxdma_handle, data->channel);

			decode_domain(data->pushbuf_domains, 10);

			mmt_log_cont(", notifier: 0x%0x, nr_subchan: %d", data->notifier_handle, data->nr_subchan);

			for (i = 0; i < 8; ++i)
				if (data->subchan[i].handle || data->subchan[i].grclass)
					mmt_log_cont(" subchan[%d]=<h:0x%0x, c:0x%0x>", i, data->subchan[i].handle, data->subchan[i].grclass);

			mmt_log_cont("%s\n", ret_err(ret, err));
		}

		// hack, fake device
		struct gpu_object *dev = gpu_object_add(fd, data->channel, data->channel, data->channel, NVRM_DEVICE_0);
		nvrm_device_set_chipset(dev, nouveau_chipset);

		// hack, fake fifo
		struct gpu_object *fifo = gpu_object_add(fd, data->channel, data->channel, 0xf1f0eeee, NVRM_FIFO_IB_G80);
		get_fifo_state(fifo);
	}
	else if (id == DRM_NOUVEAU_IOCTL_CHANNEL_FREE)
	{
		struct drm_nouveau_channel_free *data = ioctl_data;

		if (dump_decoded_ioctl_data && (ret || err))
			mmt_log("%sDRM_NOUVEAU_CHANNEL_FREE%s, channel: %d%s\n", colors->rname,
					colors->reset, data->channel, ret_err(ret, err));

		struct gpu_object *fifo = gpu_object_find(data->channel, 0xf1f0eeee);
		int i;
		for (i = 0; i < fifo->children_space; ++i)
			if (fifo->children_objects[i])
				gpu_object_destroy(fifo->children_objects[i]);
		gpu_object_destroy(fifo);
		gpu_object_destroy(gpu_object_find(data->channel, data->channel));
	}
	else if (id == DRM_NOUVEAU_IOCTL_GROBJ_ALLOC)
	{
		struct drm_nouveau_grobj_alloc *data = ioctl_data;

		if (dump_decoded_ioctl_data && (ret || err))
			mmt_log("%sDRM_NOUVEAU_GROBJ_ALLOC%s, channel: %d, handle: %s0x%x%s, class: %s0x%x%s%s\n",
					colors->rname, colors->reset, data->channel, colors->num,
					data->handle, colors->reset, colors->eval, data->class,
					colors->reset, ret_err(ret, err));

		struct gpu_object *gpu_obj = gpu_object_add(fd, data->channel, 0xf1f0eeee, data->handle, data->class);
		pushbuf_add_object(data->handle, data->class, gpu_obj);
		pushbuf_add_object_name(data->handle, data->class, gpu_obj);
	}
	else if (id == DRM_NOUVEAU_IOCTL_NOTIFIEROBJ_ALLOC)
	{
		struct drm_nouveau_notifierobj_alloc *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_NOTIFIEROBJ_ALLOC%s post, channel: %d, handle: 0x%0x, size: %d, offset: %d%s\n",
					colors->rname, colors->reset, data->channel, data->handle,
					data->size, data->offset, ret_err(ret, err));

		gpu_object_add(fd, data->channel, data->channel, data->handle, 0);
	}
	else if (id == DRM_NOUVEAU_IOCTL_GPUOBJ_FREE)
	{
		struct drm_nouveau_gpuobj_free *data = ioctl_data;

		if (dump_decoded_ioctl_data && (ret || err))
			mmt_log("%sDRM_NOUVEAU_GPUOBJ_FREE%s, channel: %d, handle: 0x%0x%s\n",
					colors->rname, colors->reset, data->channel, data->handle,
					ret_err(ret, err));

		gpu_object_destroy(gpu_object_find(data->channel, data->handle));
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_NEW)
	{
		struct drm_nouveau_gem_new *g = ioctl_data;

		if (dump_decoded_ioctl_data)
		{
			mmt_log("%sDRM_NOUVEAU_GEM_NEW%s post, ", colors->rname, colors->reset);
			dump_drm_nouveau_gem_new(g);
			mmt_log_cont("%s\n", ret_err(ret, err));
		}

		drm_nouveau_gem_new(fd, g->channel_hint, g->channel_hint, &g->info);
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_PUSHBUF)
	{
		struct drm_nouveau_gem_pushbuf *data = ioctl_data;

		struct mmt_buf *buffers = find_ptr(data->buffers, args, argc);
		struct mmt_buf *push = find_ptr(data->push, args, argc);
		struct mmt_buf *relocs = find_ptr(data->relocs, args, argc);

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_GEM_PUSHBUF%s post, channel: %d, nr_buffers: %s%d%s, buffers: 0x%" PRIx64 ", nr_relocs: %s%d%s, relocs: 0x%" PRIx64 ", nr_push: %s%d%s, push: 0x%" PRIx64 ", suffix0: 0x%x, suffix1: 0x%x, vram_available: %" PRIu64 ", gart_available: %" PRIu64 "%s\n",
					colors->rname, colors->reset, data->channel, colors->num,
					data->nr_buffers, colors->reset, data->buffers, colors->num,
					data->nr_relocs, colors->reset,data->relocs, colors->num,
					data->nr_push, colors->reset, data->push, data->suffix0,
					data->suffix1, data->vram_available, data->gart_available,
					ret_err(ret, err));

		if (buffers || push || relocs)
			demmt_nouveau_decode_gem_pushbuf_data(data->nr_buffers, (void *)buffers->data,
					data->nr_push, (void *)push->data, data->nr_relocs, (void *)relocs->data);
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_CPU_PREP)
	{
		struct drm_nouveau_gem_cpu_prep *data = ioctl_data;

		if (dump_decoded_ioctl_data && (ret || err))
			mmt_log("%sDRM_NOUVEAU_GEM_CPU_PREP%s, handle: %d, flags: 0x%0x%s\n",
					colors->rname, colors->reset, data->handle, data->flags,
					ret_err(ret, err));
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_CPU_FINI)
	{
		struct drm_nouveau_gem_cpu_fini *data = ioctl_data;

		if (dump_decoded_ioctl_data && (ret || err))
			mmt_log("%sDRM_NOUVEAU_GEM_CPU_FINI%s, handle: %d%s\n", colors->rname,
					colors->reset, data->handle, ret_err(ret, err));
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_INFO)
	{
		struct drm_nouveau_gem_info *data = ioctl_data;

		if (dump_decoded_ioctl_data)
		{
			mmt_log("%sDRM_NOUVEAU_GEM_INFO%s post, ", colors->rname, colors->reset);
			dump_drm_nouveau_gem_info(data);
			mmt_log_cont("%s\n", ret_err(ret, err));
		}

		struct gpu_object *tmp, *dev = NULL, *obj = NULL;
		for (tmp = gpu_objects; tmp != NULL; tmp = tmp->next)
		{
			if (tmp->class_ == NVRM_DEVICE_0 && tmp->fd == fd)
			{
				dev = tmp;

				struct gpu_object *tmpobj = gpu_object_find(tmp->cid, data->handle);
				if (tmpobj && obj)
				{
					mmt_error("can't uniquely determine object, assuming it's the first one%s\n", "");
					break;
				}
				obj = tmpobj;
			}
		}

		if (!dev)
			mmt_error("can't find matching device object%s\n", "");
		else if (obj)
			mmt_error("FIXME: DRM_NOUVEAU_GEM_INFO on known object%s\n", "");
		else
			drm_nouveau_gem_new(fd, dev->cid, dev->handle, data);
	}
	else if (id == DRM_IOCTL_VERSION64)
	{
		struct drm_version64 *data = ioctl_data;

		if (dump_decoded_ioctl_data)
		{
			mmt_log("%sDRM_IOCTL_VERSION64%s, version: %s%d.%d.%d%s, name_addr: 0x%"PRIx64", name_len: %"PRIu64", date_addr: 0x%"PRIx64", date_len: %"PRIu64", desc_addr: 0x%"PRIx64", desc_len: %"PRIu64"%s\n",
					colors->rname, colors->reset, colors->eval, data->version_major,
					data->version_minor, data->version_patchlevel, colors->reset,
					data->name, data->name_len, data->date, data->date_len,
					data->desc, data->desc_len, ret_err(ret, err));

			struct mmt_buf *b = NULL;
			b = find_ptr((uint64_t)(uintptr_t)data->name, args, argc);
			if (b)
				dump_mmt_buf_as_text(b, "name");

			b = find_ptr((uint64_t)(uintptr_t)data->date, args, argc);
			if (b)
				dump_mmt_buf_as_text(b, "date");

			b = find_ptr((uint64_t)(uintptr_t)data->desc, args, argc);
			if (b)
				dump_mmt_buf_as_text(b, "desc");
		}
	}
	else if (id == DRM_IOCTL_VERSION32)
	{
		struct drm_version32 *data = ioctl_data;

		if (dump_decoded_ioctl_data)
		{
			mmt_log("%sDRM_IOCTL_VERSION32%s, version: %s%d.%d.%d%s, name_addr: 0x%x, name_len: %d, date_addr: 0x%x, date_len: %d, desc_addr: 0x%x, desc_len: %d%s\n",
					colors->rname, colors->reset, colors->eval, data->version_major,
					data->version_minor, data->version_patchlevel, colors->reset,
					data->name, data->name_len, data->date, data->date_len,
					data->desc, data->desc_len, ret_err(ret, err));

			struct mmt_buf *b = NULL;
			b = find_ptr((uint64_t)(uintptr_t)data->name, args, argc);
			if (b)
				dump_mmt_buf_as_text(b, "name");

			b = find_ptr((uint64_t)(uintptr_t)data->date, args, argc);
			if (b)
				dump_mmt_buf_as_text(b, "date");

			b = find_ptr((uint64_t)(uintptr_t)data->desc, args, argc);
			if (b)
				dump_mmt_buf_as_text(b, "desc");
		}
	}
	else if (id == DRM_IOCTL_GET_MAGIC)
	{
		struct drm_auth *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_GET_MAGIC%s, magic: 0x%08x%s\n", colors->rname,
					colors->reset, data->magic, ret_err(ret, err));
	}
	else if (id == DRM_IOCTL_GEM_CLOSE)
	{
		struct drm_gem_close *data = ioctl_data;

		if (dump_decoded_ioctl_data && (ret || err))
			mmt_log("%sDRM_IOCTL_GEM_CLOSE%s, handle: %d%s\n", colors->rname,
					colors->reset, data->handle, ret_err(ret, err));
		struct gpu_object *obj = gpu_object_find(0, data->handle); // won't work for objects allocated by GEM_OPEN
		if (obj)
			gpu_object_destroy(obj);
	}
	else if (id == DRM_IOCTL_GEM_OPEN)
	{
		struct drm_gem_open *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_GEM_OPEN%s post, name: %s%d%s, handle: %s%d%s, size: %llu%s\n",
					colors->rname, colors->reset, colors->eval, data->name,
					colors->reset, colors->num, data->handle, colors->reset,
					data->size, ret_err(ret, err));
	}
	else if (id == DRM_IOCTL_GET_CAP)
	{
		struct drm_get_cap *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_GET_CAP%s, capability: %s%llu%s, value: %s%llu%s%s\n",
					colors->rname, colors->reset, colors->iname, data->capability,
					colors->reset, colors->num, data->value, colors->reset,
					ret_err(ret, err));
	}
	else if (id == DRM_IOCTL_SET_VERSION)
	{
		struct drm_set_version *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_SET_VERSION%s post, di_major: %2d, di_minor: %2d, dd_major: %2d, dd_minor: %2d\n",
					colors->rname, colors->reset, data->drm_di_major,
					data->drm_di_minor, data->drm_dd_major, data->drm_dd_minor);
	}
	else if (id == DRM_IOCTL_MODE_GETRESOURCES)
	{
		struct drm_mode_card_res *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_MODE_GETRESOURCES%s post, fb_id_ptr: %p, crtc_id_ptr: %p, connector_id_ptr: %p, "
					"encoder_id_ptr: %p, count_fbs: %d, count_crtcs: %d, count_connectors: %d, count_encoders: %d, "
					"min_width: %d, max_width: %4d, min_height: %d, max_height: %4d\n", colors->rname,
					colors->reset,
					(void *)(uintptr_t)data->fb_id_ptr,
					(void *)(uintptr_t)data->crtc_id_ptr,
					(void *)(uintptr_t)data->connector_id_ptr,
					(void *)(uintptr_t)data->encoder_id_ptr,
					data->count_fbs, data->count_crtcs, data->count_connectors,
					data->count_encoders, data->min_width, data->max_width,
					data->min_height, data->max_height);
	}
	else if (id == DRM_IOCTL_SET_MASTER)
	{
		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_SET_MASTER%s\n", colors->rname, colors->reset);
	}
	else if (id == DRM_IOCTL_DROP_MASTER)
	{
		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_DROP_MASTER%s\n", colors->rname, colors->reset);
	}
	else if (id == DRM_IOCTL_AUTH_MAGIC)
	{
		struct drm_auth *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_AUTH_MAGIC%s, magic: 0x%x\n", colors->rname, colors->reset, data->magic);
	}
	else if (id == DRM_IOCTL_GEM_FLINK)
	{
		struct drm_gem_flink *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_GEM_FLINK%s, handle: 0x%x, name: 0x%x\n",
					colors->rname, colors->reset, data->handle, data->name);
	}
	else
	{
		mmt_log("%sunknown drm ioctl%s %x\n", colors->err, colors->reset, nr);
		return 1;
	}

	return 0;
}